

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

uint llvm::findMaximalSubpartOfIllFormedUTF8Sequence(UTF8 *source,UTF8 *sourceEnd)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  Boolean BVar4;
  bool bVar5;
  
  bVar1 = *source;
  if (((long)(char)trailingBytesForUTF8[bVar1] + 1 <= (long)sourceEnd - (long)source) &&
     (BVar4 = isLegalUTF8(source,(int)((long)(char)trailingBytesForUTF8[bVar1] + 1)), BVar4 != '\0')
     ) {
    __assert_fail("!isLegalUTF8Sequence(source, sourceEnd)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTF.cpp"
                  ,0x1ac,
                  "unsigned int llvm::findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *, const UTF8 *)"
                 );
  }
  if (source == sourceEnd) {
    return 0;
  }
  if (source + 1 == sourceEnd || (byte)(bVar1 + 0x3e) < 0x1e) {
    return 1;
  }
  bVar2 = source[1];
  if (bVar1 == 0xe0) {
    bVar5 = (bVar2 & 0xe0) == 0xa0;
    goto LAB_00179533;
  }
  if ((byte)(bVar1 + 0x1f) < 0xc) {
LAB_0017951e:
    bVar5 = SBORROW1(bVar2,-0x40);
    cVar3 = '@';
  }
  else {
    if (bVar1 != 0xed) {
      if ((bVar1 & 0xfe) != 0xee) {
        if (bVar1 == 0xf0) {
          if (0x2f < (byte)(bVar2 + 0x70)) {
            return 1;
          }
        }
        else if ((byte)(bVar1 + 0xf) < 3) {
          if (-0x41 < (char)bVar2) {
            return 1;
          }
        }
        else {
          if (bVar1 != 0xf4) {
            if (0xf4 < bVar1 || (char)bVar1 < -0x3e) {
              return 1;
            }
            __assert_fail("(b1 >= 0x80 && b1 <= 0xC1) || b1 >= 0xF5",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTF.cpp"
                          ,0x1fa,
                          "unsigned int llvm::findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *, const UTF8 *)"
                         );
          }
          if (-0x71 < (char)bVar2) {
            return 1;
          }
        }
        if (source + 2 != sourceEnd) {
          return (char)source[2] < -0x40 | 2;
        }
        return 2;
      }
      goto LAB_0017951e;
    }
    bVar5 = SBORROW1(bVar2,-0x60);
    cVar3 = '`';
  }
  bVar5 = bVar5 != (char)(bVar2 + cVar3) < '\0';
LAB_00179533:
  return bVar5 + 1;
}

Assistant:

static unsigned
findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *source,
                                          const UTF8 *sourceEnd) {
  UTF8 b1, b2, b3;

  assert(!isLegalUTF8Sequence(source, sourceEnd));

  /*
   * Unicode 6.3.0, D93b:
   *
   *   Maximal subpart of an ill-formed subsequence: The longest code unit
   *   subsequence starting at an unconvertible offset that is either:
   *   a. the initial subsequence of a well-formed code unit sequence, or
   *   b. a subsequence of length one.
   */

  if (source == sourceEnd)
    return 0;

  /*
   * Perform case analysis.  See Unicode 6.3.0, Table 3-7. Well-Formed UTF-8
   * Byte Sequences.
   */

  b1 = *source;
  ++source;
  if (b1 >= 0xC2 && b1 <= 0xDF) {
    /*
     * First byte is valid, but we know that this code unit sequence is
     * invalid, so the maximal subpart has to end after the first byte.
     */
    return 1;
  }

  if (source == sourceEnd)
    return 1;

  b2 = *source;
  ++source;

  if (b1 == 0xE0) {
    return (b2 >= 0xA0 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 >= 0xE1 && b1 <= 0xEC) {
    return (b2 >= 0x80 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 == 0xED) {
    return (b2 >= 0x80 && b2 <= 0x9F) ? 2 : 1;
  }
  if (b1 >= 0xEE && b1 <= 0xEF) {
    return (b2 >= 0x80 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 == 0xF0) {
    if (b2 >= 0x90 && b2 <= 0xBF) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }
  if (b1 >= 0xF1 && b1 <= 0xF3) {
    if (b2 >= 0x80 && b2 <= 0xBF) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }
  if (b1 == 0xF4) {
    if (b2 >= 0x80 && b2 <= 0x8F) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }

  assert((b1 >= 0x80 && b1 <= 0xC1) || b1 >= 0xF5);
  /*
   * There are no valid sequences that start with these bytes.  Maximal subpart
   * is defined to have length 1 in these cases.
   */
  return 1;
}